

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
* __thiscall
helics::BrokerBase::processBaseCommands
          (pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           *__return_storage_ptr__,BrokerBase *this,ActionMessage *command)

{
  GlobalFederateId federateID;
  pointer pcVar1;
  size_type sVar2;
  string_view quoteChars;
  string_view message;
  string_view message_00;
  bool bVar3;
  LogLevels level;
  size_type sVar4;
  string *psVar5;
  unsigned_long newSize;
  byte *pbVar6;
  char *pcVar7;
  int iVar8;
  element_type *peVar9;
  ulong uVar10;
  string_view V;
  string_view V_00;
  string_view level_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view trimCharacters;
  string_view line;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  string_view str;
  string_view str_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> message_01;
  delimiter_compression in_stack_fffffffffffffeb8;
  string_viewVector res;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  ActionMessage udisconnect;
  char *extraout_RDX;
  
  pbVar6 = (command->payload).heap;
  local_f8._M_str = (char *)pbVar6;
  local_f8._M_len = (command->payload).bufferSize;
  sVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find(&local_f8,'#',0);
  if (sVar4 != 0xffffffffffffffff) {
    local_f8 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_f8,0,sVar4 - 1);
  }
  trimCharacters._M_str = (char *)pbVar6;
  trimCharacters._M_len = (size_t)" \t\n\r";
  gmlc::utilities::string_viewOps::trimString
            ((string_viewOps *)&local_f8,(string_view *)0x4,trimCharacters);
  quoteChars._M_str = (char *)0x3a5532;
  quoteChars._M_len = 3;
  line._M_str = (char *)0x2;
  line._M_len = (size_t)local_f8._M_str;
  gmlc::utilities::string_viewOps::splitlineQuotes
            (&res,(string_viewOps *)local_f8._M_len,line,(string_view)ZEXT816(0x397c9f),quoteChars,
             in_stack_fffffffffffffeb8);
  if (res.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      res.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    udisconnect.dest_id.gid = 0;
    udisconnect.dest_handle.hid = 0;
    udisconnect.messageAction = cmd_ignore;
    udisconnect.messageID = 0;
    udisconnect.source_id.gid = 0;
    udisconnect.source_handle.hid = 0;
    __return_storage_ptr__->first = true;
    CLI::std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector(&__return_storage_ptr__->second,
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&udisconnect);
    CLI::std::
    _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Vector_base((_Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)&udisconnect);
    goto LAB_00282d0d;
  }
  __y._M_str = "ignore";
  __y._M_len = 6;
  bVar3 = std::operator==(*res.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,__y);
  if (!bVar3) {
    __y_00._M_str = "terminate";
    __y_00._M_len = 9;
    bVar3 = std::operator==(*res.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,__y_00);
    if (bVar3) {
      if (this->allowRemoteControl == true) {
        if (5 < (this->maxLogLevel).super___atomic_base<int>._M_i) {
          message._M_str = " received terminate instruction via command instruction";
          message._M_len = 0x37;
          name._M_str = (this->identifier)._M_dataplus._M_p;
          name._M_len = (this->identifier)._M_string_length;
          sendToLogger(this,(GlobalFederateId)(this->global_broker_id_local).gid,6,name,message,
                       false);
        }
        ActionMessage::ActionMessage(&udisconnect,cmd_user_disconnect);
        addActionMessage(this,&udisconnect);
        ActionMessage::~ActionMessage(&udisconnect);
      }
    }
    else {
      __y_01._M_str = "echo";
      __y_01._M_len = 4;
      bVar3 = std::operator==(*res.
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,__y_01);
      if (bVar3) {
        if (5 < (this->maxLogLevel).super___atomic_base<int>._M_i) {
          message_00._M_str = " received echo command via command instruction";
          message_00._M_len = 0x2e;
          name_00._M_str = (this->identifier)._M_dataplus._M_p;
          name_00._M_len = (this->identifier)._M_string_length;
          sendToLogger(this,(GlobalFederateId)(this->global_broker_id_local).gid,6,name_00,
                       message_00,false);
        }
        ActionMessage::swapSourceDest(command);
        SmallBuffer::operator=(&command->payload,(char (*) [11])"echo_reply");
        psVar5 = ActionMessage::getString_abi_cxx11_(command,1);
        str._M_str = (psVar5->_M_dataplus)._M_p;
        str._M_len = psVar5->_M_string_length;
        ActionMessage::setString(command,0,str);
        str_00._M_str = (this->identifier)._M_dataplus._M_p;
        str_00._M_len = (this->identifier)._M_string_length;
        ActionMessage::setString(command,1,str_00);
        addActionMessage(this,command);
      }
      else {
        __y_02._M_str = "log";
        __y_02._M_len = 3;
        bVar3 = std::operator==(*res.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,__y_02);
        if (bVar3) {
          if (5 < (this->maxLogLevel).super___atomic_base<int>._M_i) {
            federateID.gid = (this->global_broker_id_local).gid;
            psVar5 = ActionMessage::getString_abi_cxx11_(command,1);
            pcVar1 = (psVar5->_M_dataplus)._M_p;
            sVar2 = psVar5->_M_string_length;
            udisconnect._0_8_ = (command->payload).bufferSize;
            udisconnect._8_8_ = (command->payload).heap;
            message_01 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                                   ((basic_string_view<char,_std::char_traits<char>_> *)&udisconnect
                                    ,4,0xffffffffffffffff);
            name_01._M_str = pcVar1;
            name_01._M_len = sVar2;
            sendToLogger(this,federateID,6,name_01,message_01,false);
          }
        }
        else {
          __y_03._M_str = "logbuffer";
          __y_03._M_len = 9;
          bVar3 = std::operator==(*res.
                                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,__y_03);
          if (bVar3) {
            uVar10 = (long)res.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)res.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            if (uVar10 < 0x11) {
              peVar9 = (this->mLogManager).
                       super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            }
            else {
              __y_06._M_str = "stop";
              __y_06._M_len = 4;
              pcVar7 = "stop";
              bVar3 = std::operator==(res.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1],__y_06);
              peVar9 = (this->mLogManager).
                       super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (!bVar3) {
                V._M_str = (char *)0xa;
                V._M_len = (size_t)res.
                                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1]._M_str;
                newSize = gmlc::utilities::numeric_conversion<unsigned_long>
                                    ((utilities *)
                                     res.
                                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1]._M_len,V,
                                     (unsigned_long)pcVar7);
                LogBuffer::resize(&peVar9->mLogBuffer,newSize);
                goto LAB_00282cd4;
              }
            }
            LogBuffer::enable(&peVar9->mLogBuffer,uVar10 < 0x11);
          }
          else {
            __y_04._M_str = "remotelog";
            __y_04._M_len = 9;
            bVar3 = std::operator==(*res.
                                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,__y_04);
            if (!bVar3) {
              __return_storage_ptr__->first = false;
              CLI::std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::vector(&__return_storage_ptr__->second,&res);
              goto LAB_00282d0d;
            }
            if ((ulong)((long)res.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)res.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
              peVar9 = (this->mLogManager).
                       super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              iVar8 = peVar9->consoleLogLevel;
LAB_0028300b:
              LogManager::updateRemote(peVar9,(GlobalFederateId)(command->source_id).gid,iVar8);
            }
            else {
              __y_05._M_str = "stop";
              __y_05._M_len = 4;
              iVar8 = 0x39c794;
              bVar3 = std::operator==(res.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1],__y_05);
              if (bVar3) {
                peVar9 = (this->mLogManager).
                         super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                iVar8 = -4;
                goto LAB_0028300b;
              }
              pcVar7 = res.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._M_str;
              if ((int)*pcVar7 - 0x30U < 10) {
                V_00._M_str = (char *)0xfffffffffffffffc;
                V_00._M_len = (size_t)pcVar7;
                level = gmlc::utilities::numeric_conversion<int>
                                  ((utilities *)
                                   res.
                                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1]._M_len,V_00,iVar8);
              }
              else {
                level_00._M_str = extraout_RDX;
                level_00._M_len = (size_t)pcVar7;
                level = logLevelFromString((helics *)
                                           res.
                                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1]._M_len,
                                           level_00);
              }
              LogManager::updateRemote
                        ((this->mLogManager).
                         super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (GlobalFederateId)(command->source_id).gid,level);
            }
            LOCK();
            (this->maxLogLevel).super___atomic_base<int>._M_i =
                 (((this->mLogManager).
                   super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 maxLogLevel).super___atomic_base<int>._M_i;
            UNLOCK();
          }
        }
      }
    }
  }
LAB_00282cd4:
  __return_storage_ptr__->first = true;
  CLI::std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&__return_storage_ptr__->second,&res);
LAB_00282d0d:
  CLI::std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&res.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::vector<std::string_view>>
    BrokerBase::processBaseCommands(ActionMessage& command)
{
    auto cmd = command.payload.to_string();
    auto commentLoc = cmd.find('#');
    if (commentLoc != std::string_view::npos) {
        cmd = cmd.substr(0, commentLoc - 1);
    }
    gmlc::utilities::string_viewOps::trimString(cmd);
    auto res = gmlc::utilities::string_viewOps::splitlineQuotes(
        cmd,
        " |",
        gmlc::utilities::string_viewOps::default_quote_chars,
        gmlc::utilities::string_viewOps::delimiter_compression::on);
    if (res.empty()) {
        return {true, {}};
    }
    if (res[0] == "ignore") {
    } else if (res[0] == "terminate") {
        if (allowRemoteControl) {
            LOG_SUMMARY(global_broker_id_local,
                        identifier,
                        " received terminate instruction via command instruction")
            const ActionMessage udisconnect(CMD_USER_DISCONNECT);
            addActionMessage(udisconnect);
        }
    } else if (res[0] == "echo") {
        LOG_SUMMARY(global_broker_id_local,
                    identifier,
                    " received echo command via command instruction")
        command.swapSourceDest();
        command.payload = "echo_reply";
        command.setString(targetStringLoc, command.getString(sourceStringLoc));
        command.setString(sourceStringLoc, identifier);
        addActionMessage(command);
    } else if (res[0] == "log") {
        LOG_SUMMARY(global_broker_id_local,
                    command.getString(sourceStringLoc),
                    command.payload.to_string().substr(4));
    } else if (res[0] == "logbuffer") {
        if (res.size() > 1) {
            if (res[1] == "stop") {
                mLogManager->getLogBuffer().enable(false);
            } else {
                mLogManager->getLogBuffer().resize(gmlc::utilities::numeric_conversion<std::size_t>(
                    res[1], LogBuffer::cDefaultBufferSize));
            }
        } else {
            mLogManager->getLogBuffer().enable(true);
        }
    } else if (res[0] == "remotelog") {
        if (res.size() > 1) {
            if (res[1] == "stop") {
                mLogManager->updateRemote(command.source_id, HELICS_LOG_LEVEL_NO_PRINT);
            } else {
                int newLogLevel = HELICS_LOG_LEVEL_NO_PRINT;
                if (isdigit(res[1][0]) != 0) {
                    newLogLevel =
                        gmlc::utilities::numeric_conversion<int>(res[1], HELICS_LOG_LEVEL_NO_PRINT);
                } else {
                    newLogLevel = logLevelFromString(res[1]);
                }
                mLogManager->updateRemote(command.source_id, newLogLevel);
            }
        } else {
            mLogManager->updateRemote(command.source_id, mLogManager->getConsoleLevel());
        }
        maxLogLevel.store(mLogManager->getMaxLevel());
    } else {
        return {false, res};
    }
    return {true, res};
}